

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

bool el::Configurations::Parser::parseLine
               (string *line,string *currConfigStr,string *currLevelStr,Level *currLevel,
               Configurations *conf)

{
  ulong uVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  ostream *poVar10;
  bool bVar11;
  Level LVar12;
  size_type sVar13;
  long lVar14;
  string currValue;
  stringstream internalInfoStream;
  ConfigurationType local_21c;
  long *local_218;
  long local_210;
  long local_208 [2];
  ulong local_1f8;
  string local_1f0;
  Level *local_1d0;
  ulong local_1c8;
  Configurations *local_1c0;
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1c0 = conf;
  base::utils::Str::rtrim(line);
  base::utils::Str::ltrim(line);
  std::__cxx11::string::_M_assign((string *)line);
  bVar6 = isComment(line);
  bVar11 = true;
  if (bVar6) goto LAB_0015993e;
  ignoreComments(line);
  base::utils::Str::rtrim(line);
  base::utils::Str::ltrim(line);
  std::__cxx11::string::_M_assign((string *)line);
  if (line->_M_string_length == 0) goto LAB_0015993e;
  bVar6 = isLevel(line);
  if (bVar6) {
    if (2 < line->_M_string_length) {
      local_1d0 = currLevel;
      std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
      std::__cxx11::string::operator=((string *)currLevelStr,(string *)local_1b8);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      sVar3 = currLevelStr->_M_string_length;
      if (sVar3 != 0) {
        pcVar4 = (currLevelStr->_M_dataplus)._M_p;
        sVar13 = 0;
        do {
          iVar7 = toupper((int)pcVar4[sVar13]);
          pcVar4[sVar13] = (char)iVar7;
          sVar13 = sVar13 + 1;
        } while (sVar3 != sVar13);
      }
      std::__cxx11::string::_M_assign((string *)currLevelStr);
      base::utils::Str::rtrim(currLevelStr);
      base::utils::Str::ltrim(currLevelStr);
      std::__cxx11::string::_M_assign((string *)currLevelStr);
      pcVar5 = (currLevelStr->_M_dataplus)._M_p;
      lVar14 = 0;
      do {
        bVar6 = base::utils::Str::cStringCaseEq(pcVar5,*(char **)((long)&stringToLevelMap + lVar14))
        ;
        if (bVar6) {
          line = (string *)(ulong)*(uint *)((long)&DAT_00184068 + lVar14);
        }
        LVar12 = (Level)line;
        if (bVar6) goto LAB_0015910c;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x80);
      LVar12 = Unknown;
LAB_0015910c:
      *local_1d0 = LVar12;
    }
    goto LAB_0015993e;
  }
  uVar8 = std::__cxx11::string::find((char)line,0x3d);
  iVar7 = std::__cxx11::string::compare((char *)line);
  local_21c = Unknown;
  if (iVar7 != 0) {
    cVar2 = *(line->_M_dataplus)._M_p;
    if ((byte)(cVar2 + 0xbfU) < 0x1a) {
      if (uVar8 != 0xffffffffffffffff) {
LAB_00159183:
        if (uVar8 < line->_M_string_length) {
          uVar9 = std::__cxx11::string::find((char)line,0x3d);
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
          local_1f8 = uVar9;
          local_1d0 = currLevel;
          std::__cxx11::string::operator=((string *)currConfigStr,(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          sVar3 = currConfigStr->_M_string_length;
          if (sVar3 != 0) {
            pcVar4 = (currConfigStr->_M_dataplus)._M_p;
            sVar13 = 0;
            do {
              iVar7 = toupper((int)pcVar4[sVar13]);
              pcVar4[sVar13] = (char)iVar7;
              sVar13 = sVar13 + 1;
            } while (sVar3 != sVar13);
          }
          std::__cxx11::string::_M_assign((string *)currConfigStr);
          base::utils::Str::rtrim(currConfigStr);
          base::utils::Str::ltrim(currConfigStr);
          std::__cxx11::string::_M_assign((string *)currConfigStr);
          pcVar5 = (currConfigStr->_M_dataplus)._M_p;
          lVar14 = 8;
          do {
            bVar6 = base::utils::Str::cStringCaseEq(pcVar5,*(char **)(&UNK_001840d8 + lVar14));
            if (bVar6) {
              local_21c = *(ConfigurationType *)((long)&configStringToTypeMap + lVar14);
              goto LAB_0015928b;
            }
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0xa8);
          local_21c = Unknown;
LAB_0015928b:
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
          std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          base::utils::Str::rtrim(&local_1f0);
          base::utils::Str::ltrim(&local_1f0);
          std::__cxx11::string::_M_assign((string *)&local_1f0);
          local_1f8 = std::__cxx11::string::find((char *)&local_1f0,0x16cd7d,0);
          currLevel = local_1d0;
          uVar8 = 0xffffffffffffffff;
          if (local_1f8 != 0xffffffffffffffff) {
            uVar8 = std::__cxx11::string::find((char *)&local_1f0,0x16cd7d,local_1f8 + 1);
            if (uVar8 != 0xffffffffffffffff) {
              do {
                uVar1 = uVar8 - 1;
                if (local_1f0._M_string_length <= uVar1) {
                  uVar9 = std::__throw_out_of_range_fmt
                                    (
                                    "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                    );
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                  std::ios_base::~ios_base(local_138);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                             local_1f0.field_2._M_local_buf[0]) + 1);
                  }
                  _Unwind_Resume(uVar9);
                }
                if (local_1f0._M_dataplus._M_p[uVar1] != '\\') goto LAB_001593bb;
                std::__cxx11::string::erase((ulong)&local_1f0,uVar1);
                std::__cxx11::string::_M_assign((string *)&local_1f0);
                uVar8 = std::__cxx11::string::find((char *)&local_1f0,0x16cd7d,uVar8 + 2);
              } while (uVar8 != 0xffffffffffffffff);
            }
            uVar8 = 0xffffffffffffffff;
          }
LAB_001593bb:
          uVar1 = local_1f8;
          if (uVar8 != 0xffffffffffffffff && local_1f8 != 0xffffffffffffffff) {
            local_1c8 = uVar8;
            if (uVar8 <= local_1f8) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Configuration error - No ending quote found in [",
                         0x30);
              poVar10 = std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1ba);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,") [(quotesStart < quotesEnd)",0x1c);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] WITH MESSAGE \"",0x10);
              std::__cxx11::stringbuf::str();
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_218,local_210);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
              std::endl<char,std::char_traits<char>>(poVar10);
              if (local_218 != local_208) {
                operator_delete(local_218,local_208[0] + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
            }
            if (uVar1 + 1 == local_1c8) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Empty configuration value for [",0x1f);
              poVar10 = std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1bb);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,") [(quotesStart + 1 != quotesEnd)",0x21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] WITH MESSAGE \"",0x10);
              std::__cxx11::stringbuf::str();
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_218,local_210);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
              std::endl<char,std::char_traits<char>>(poVar10);
              if (local_218 != local_208) {
                operator_delete(local_218,local_208[0] + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
            }
            if (local_1f8 != local_1c8 && uVar1 + 1 != local_1c8) {
              std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_1f0);
              std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b8);
              if (local_1b8[0] != local_1a8) {
                operator_delete(local_1b8[0],local_1a8[0] + 1);
              }
            }
          }
        }
      }
    }
    else if (('`' < cVar2) && (uVar8 != 0xffffffffffffffff && cVar2 < '{')) goto LAB_00159183;
  }
  if (*currLevel == Unknown) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unrecognized severity level [",0x1d);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(currLevelStr->_M_dataplus)._M_p,
                         currLevelStr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1c2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,") [*currLevel != Level::Unknown",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_218,local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_21c == Unknown) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unrecognized configuration [",0x1c);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(currConfigStr->_M_dataplus)._M_p,
                         currConfigStr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1c3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,") [currConfig != ConfigurationType::Unknown",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_218,local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (*currLevel == Unknown || local_21c == Unknown) {
    bVar11 = false;
  }
  else {
    set(local_1c0,*currLevel,local_21c,&local_1f0);
  }
LAB_0015993e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  return bVar11;
}

Assistant:

bool Configurations::Parser::parseLine(std::string* line, std::string* currConfigStr, std::string* currLevelStr,
                                       Level* currLevel,
                                       Configurations* conf) {
  ConfigurationType currConfig = ConfigurationType::Unknown;
  std::string currValue = std::string();
  *line = base::utils::Str::trim(*line);
  if (isComment(*line)) return true;
  ignoreComments(line);
  *line = base::utils::Str::trim(*line);
  if (line->empty()) {
    // Comment ignored
    return true;
  }
  if (isLevel(*line)) {
    if (line->size() <= 2) {
      return true;
    }
    *currLevelStr = line->substr(1, line->size() - 2);
    *currLevelStr = base::utils::Str::toUpper(*currLevelStr);
    *currLevelStr = base::utils::Str::trim(*currLevelStr);
    *currLevel = LevelHelper::convertFromString(currLevelStr->c_str());
    return true;
  }
  if (isConfig(*line)) {
    std::size_t assignment = line->find('=');
    *currConfigStr = line->substr(0, assignment);
    *currConfigStr = base::utils::Str::toUpper(*currConfigStr);
    *currConfigStr = base::utils::Str::trim(*currConfigStr);
    currConfig = ConfigurationTypeHelper::convertFromString(currConfigStr->c_str());
    currValue = line->substr(assignment + 1);
    currValue = base::utils::Str::trim(currValue);
    std::size_t quotesStart = currValue.find("\"", 0);
    std::size_t quotesEnd = std::string::npos;
    if (quotesStart != std::string::npos) {
      quotesEnd = currValue.find("\"", quotesStart + 1);
      while (quotesEnd != std::string::npos && currValue.at(quotesEnd - 1) == '\\') {
        currValue = currValue.erase(quotesEnd - 1, 1);
        quotesEnd = currValue.find("\"", quotesEnd + 2);
      }
    }
    if (quotesStart != std::string::npos && quotesEnd != std::string::npos) {
      // Quote provided - check and strip if valid
      ELPP_ASSERT((quotesStart < quotesEnd), "Configuration error - No ending quote found in ["
                  << currConfigStr << "]");
      ELPP_ASSERT((quotesStart + 1 != quotesEnd), "Empty configuration value for [" << currConfigStr << "]");
      if ((quotesStart != quotesEnd) && (quotesStart + 1 != quotesEnd)) {
        // Explicit check in case if assertion is disabled
        currValue = currValue.substr(quotesStart + 1, quotesEnd - 1);
      }
    }
  }
  ELPP_ASSERT(*currLevel != Level::Unknown, "Unrecognized severity level [" << *currLevelStr << "]");
  ELPP_ASSERT(currConfig != ConfigurationType::Unknown, "Unrecognized configuration [" << *currConfigStr << "]");
  if (*currLevel == Level::Unknown || currConfig == ConfigurationType::Unknown) {
    return false;  // unrecognizable level or config
  }
  conf->set(*currLevel, currConfig, currValue);
  return true;
}